

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O3

DdHashItem * cuddHashTableAlloc(DdHashTable *hash)

{
  int *piVar1;
  char *__ptr;
  DdManager *pDVar2;
  DdSubtable *pDVar3;
  DdHashItem **ppDVar4;
  DdHashItem *pDVar5;
  int iVar6;
  long lVar7;
  _func_void_long *p_Var8;
  ulong __size;
  ulong uVar9;
  
  p_Var8 = Extra_UtilMMoutOfMemory;
  pDVar5 = hash->nextFree;
  if (pDVar5 == (DdHashItem *)0x0) {
    uVar9 = (ulong)hash->itemsize;
    __size = (ulong)(hash->itemsize * 0x3ff);
    ppDVar4 = (DdHashItem **)malloc(__size);
    if (ppDVar4 == (DdHashItem **)0x0) {
      __ptr = hash->manager->stash;
      if (__ptr == (char *)0x0) {
LAB_007f975b:
        (*p_Var8)(__size);
        hash->manager->errorCode = CUDD_MEMORY_OUT;
        return (DdHashItem *)0x0;
      }
      free(__ptr);
      pDVar2 = hash->manager;
      pDVar2->stash = (char *)0x0;
      pDVar2->maxCacheHard = pDVar2->cacheSlots - 1;
      pDVar2->cacheSlack = ~pDVar2->cacheSlots;
      iVar6 = pDVar2->size;
      if (0 < (long)iVar6) {
        pDVar3 = pDVar2->subtables;
        lVar7 = 0;
        do {
          piVar1 = (int *)((long)&pDVar3->maxKeys + lVar7);
          *piVar1 = *piVar1 << 2;
          lVar7 = lVar7 + 0x38;
        } while ((long)iVar6 * 0x38 - lVar7 != 0);
      }
      pDVar2->gcFrac = 0.2;
      pDVar2->minDead = (uint)(long)((double)pDVar2->slots * 0.2);
      ppDVar4 = (DdHashItem **)malloc(__size);
      p_Var8 = Extra_UtilMMoutOfMemory;
      if (ppDVar4 == (DdHashItem **)0x0) goto LAB_007f975b;
    }
    *ppDVar4 = (DdHashItem *)hash->memoryList;
    hash->memoryList = ppDVar4;
    pDVar5 = (DdHashItem *)((long)ppDVar4 + uVar9);
    iVar6 = 0x3fd;
    do {
      *(ulong *)((long)ppDVar4 + uVar9) = (long)ppDVar4 + uVar9 * 2;
      ppDVar4 = (DdHashItem **)((long)ppDVar4 + uVar9);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    *(undefined8 *)((long)ppDVar4 + uVar9) = 0;
  }
  hash->nextFree = pDVar5->next;
  return pDVar5;
}

Assistant:

DD_INLINE
static DdHashItem *
cuddHashTableAlloc(
  DdHashTable * hash)
{
    int i;
    unsigned int itemsize = hash->itemsize;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    DdHashItem **mem, *thisOne, *next, *item;

    if (hash->nextFree == NULL) {
        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        mem = (DdHashItem **) ABC_ALLOC(char,(DD_MEM_CHUNK+1) * itemsize);
        MMoutOfMemory = saveHandler;
#ifdef __osf__
#pragma pointer_size restore
#endif
        if (mem == NULL) {
            if (hash->manager->stash != NULL) {
                ABC_FREE(hash->manager->stash);
                hash->manager->stash = NULL;
                /* Inhibit resizing of tables. */
                hash->manager->maxCacheHard = hash->manager->cacheSlots - 1;
                hash->manager->cacheSlack = - (int) (hash->manager->cacheSlots + 1);
                for (i = 0; i < hash->manager->size; i++) {
                    hash->manager->subtables[i].maxKeys <<= 2;
                }
                hash->manager->gcFrac = 0.2;
                hash->manager->minDead =
                    (unsigned) (0.2 * (double) hash->manager->slots);
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
                mem = (DdHashItem **) ABC_ALLOC(char,(DD_MEM_CHUNK+1) * itemsize);
#ifdef __osf__
#pragma pointer_size restore
#endif
            }
            if (mem == NULL) {
                (*MMoutOfMemory)((long)((DD_MEM_CHUNK + 1) * itemsize));
                hash->manager->errorCode = CUDD_MEMORY_OUT;
                return(NULL);
            }
        }

        mem[0] = (DdHashItem *) hash->memoryList;
        hash->memoryList = mem;

        thisOne = (DdHashItem *) ((char *) mem + itemsize);
        hash->nextFree = thisOne;
        for (i = 1; i < DD_MEM_CHUNK; i++) {
            next = (DdHashItem *) ((char *) thisOne + itemsize);
            thisOne->next = next;
            thisOne = next;
        }

        thisOne->next = NULL;

    }
    item = hash->nextFree;
    hash->nextFree = item->next;
    return(item);

}